

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O0

IndexTableSegment * __thiscall
ASDCP::MXF::IndexTableSegment::InitFromTLVSet(IndexTableSegment *this,TLVReader *TLVSet)

{
  bool bVar1;
  int iVar2;
  ui32_t uVar3;
  MDDEntry *pMVar4;
  size_type sVar5;
  ILogSink *this_00;
  TLVReader *in_RDX;
  Result_t *local_5a0;
  byte local_58b;
  undefined1 local_470 [8];
  IndexEntry tmp_item;
  ui32_t i;
  ui32_t decoder_item_size;
  ui32_t item_size;
  ui32_t item_count;
  bool rc;
  TLVReader local_3d8;
  TLVReader local_370;
  TLVReader local_308;
  TLVReader local_2a0;
  TLVReader local_238;
  TLVReader local_1d0;
  TLVReader local_168;
  TLVReader local_100;
  undefined1 local_88 [8];
  Result_t result;
  TLVReader *TLVSet_local;
  IndexTableSegment *this_local;
  
  InterchangeObject::InitFromTLVSet((InterchangeObject *)local_88,TLVSet);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_IndexEditRate);
    TLVReader::ReadObject(&local_100,(MDDEntry *)in_RDX,(IArchive *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)&local_100);
    Kumu::Result_t::~Result_t((Result_t *)&local_100);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_IndexStartPosition);
    TLVReader::ReadUi64(&local_168,(MDDEntry *)in_RDX,(ui64_t *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)&local_168);
    Kumu::Result_t::~Result_t((Result_t *)&local_168);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_IndexDuration);
    TLVReader::ReadUi64(&local_1d0,(MDDEntry *)in_RDX,(ui64_t *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)&local_1d0);
    Kumu::Result_t::~Result_t((Result_t *)&local_1d0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_EditUnitByteCount);
    TLVReader::ReadUi32(&local_238,(MDDEntry *)in_RDX,(ui32_t *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)&local_238);
    Kumu::Result_t::~Result_t((Result_t *)&local_238);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,MDD_Core_IndexSID);
    TLVReader::ReadUi32(&local_2a0,(MDDEntry *)in_RDX,(ui32_t *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)&local_2a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_2a0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,MDD_Core_BodySID);
    TLVReader::ReadUi32(&local_308,(MDDEntry *)in_RDX,(ui32_t *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)&local_308);
    Kumu::Result_t::~Result_t((Result_t *)&local_308);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_SliceCount);
    TLVReader::ReadUi8(&local_370,(MDDEntry *)in_RDX,pMVar4->ul);
    Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)&local_370);
    Kumu::Result_t::~Result_t((Result_t *)&local_370);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_PosTableCount);
    TLVReader::ReadUi8(&local_3d8,(MDDEntry *)in_RDX,pMVar4->ul);
    Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)&local_3d8);
    Kumu::Result_t::~Result_t((Result_t *)&local_3d8);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegment_DeltaEntryArray);
    TLVReader::ReadObject((TLVReader *)&item_count,(MDDEntry *)in_RDX,(IArchive *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)&item_count);
    Kumu::Result_t::~Result_t((Result_t *)&item_count);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegment_IndexEntryArray);
    item_size._3_1_ = TLVReader::FindTL(in_RDX,pMVar4);
    if ((bool)item_size._3_1_) {
      uVar3 = FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
              ::ItemSize((FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
                          *)&TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_left);
      bVar1 = Kumu::MemIOReader::ReadUi32BE(&in_RDX->super_MemIOReader,&decoder_item_size);
      if ((bVar1) && (bVar1 = Kumu::MemIOReader::ReadUi32BE(&in_RDX->super_MemIOReader,&i), bVar1))
      {
        tmp_item.StreamOffset._4_4_ = 0;
        while( true ) {
          local_58b = 0;
          if (tmp_item.StreamOffset._4_4_ < decoder_item_size) {
            local_58b = item_size._3_1_;
          }
          if ((local_58b & 1) == 0) break;
          IndexEntry::IndexEntry((IndexEntry *)local_470);
          item_size._3_1_ =
               IndexEntry::Unarchive((IndexEntry *)local_470,&in_RDX->super_MemIOReader);
          if (((bool)item_size._3_1_) &&
             (std::
              vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
              ::push_back((vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                           *)&TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_right,(value_type *)local_470), uVar3 < i)) {
            item_size._3_1_ = Kumu::MemIOReader::SkipOffset(&in_RDX->super_MemIOReader,i - uVar3);
          }
          IndexEntry::~IndexEntry((IndexEntry *)local_470);
          tmp_item.StreamOffset._4_4_ = tmp_item.StreamOffset._4_4_ + 1;
        }
        sVar5 = std::
                vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                ::size((vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                        *)&TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_right);
        if (sVar5 != decoder_item_size) {
          this_00 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error
                    (this_00,"Malformed index table segment, could not decode all IndexEntries.\n");
          Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_KLV_CODING);
          goto LAB_00254d7a;
        }
      }
    }
    if ((item_size._3_1_ & 1) == 0) {
      local_5a0 = (Result_t *)Kumu::RESULT_FALSE;
    }
    else {
      local_5a0 = (Result_t *)Kumu::RESULT_OK;
    }
    Kumu::Result_t::operator=((Result_t *)local_88,local_5a0);
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_88);
LAB_00254d7a:
  Kumu::Result_t::~Result_t((Result_t *)local_88);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::IndexTableSegment::InitFromTLVSet(TLVReader& TLVSet)
{
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(IndexTableSegmentBase, IndexEditRate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi64(OBJ_READ_ARGS(IndexTableSegmentBase, IndexStartPosition));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi64(OBJ_READ_ARGS(IndexTableSegmentBase, IndexDuration));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(IndexTableSegmentBase, EditUnitByteCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(IndexTableSegmentBase, IndexSID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(EssenceContainerData, BodySID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi8(OBJ_READ_ARGS(IndexTableSegmentBase, SliceCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi8(OBJ_READ_ARGS(IndexTableSegmentBase, PosTableCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(IndexTableSegment, DeltaEntryArray));

  if ( ASDCP_SUCCESS(result) )
    {
      bool rc = TLVSet.FindTL(m_Dict->Type(MDD_IndexTableSegment_IndexEntryArray));

      if ( rc )
	{
	  ui32_t item_count, item_size;
	  ui32_t const decoder_item_size = IndexEntryArray.ItemSize();

	  if ( TLVSet.ReadUi32BE(&item_count) )
	    {
	      if ( TLVSet.ReadUi32BE(&item_size) )
		{
		  for ( ui32_t i = 0; i < item_count && rc; ++i )
		    {
		      IndexEntry tmp_item;
		      rc = tmp_item.Unarchive(&TLVSet);

		      if ( rc )
			{
			  IndexEntryArray.push_back(tmp_item);

			  if ( decoder_item_size < item_size )
			    {
			      rc = TLVSet.SkipOffset(item_size - decoder_item_size);
			    }
			}
		    }
          if (IndexEntryArray.size() != item_count)
          {
              DefaultLogSink().Error("Malformed index table segment, could not decode all IndexEntries.\n");
              return RESULT_KLV_CODING;
          }
		}
	    }
	}

      result = rc ? RESULT_OK : RESULT_FALSE;
    }

  return result;
}